

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateImplementation
          (ServiceGenerator *this,Printer *printer)

{
  mapped_type *this_00;
  int in_EDX;
  allocator<char> local_59;
  key_type local_58;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  SimpleItoa_abi_cxx11_(&local_38,(protobuf *)(ulong)(uint)this->index_in_metadata_,in_EDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"index",&local_59);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->vars_,&local_58);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Print(local_18,&this->vars_,
                     "$classname$::~$classname$() {}\n\nconst ::google::protobuf::ServiceDescriptor* $classname$::descriptor() {\n  $file_namespace$::protobuf_AssignDescriptorsOnce();\n  return $file_namespace$::file_level_service_descriptors[$index$];\n}\n\nconst ::google::protobuf::ServiceDescriptor* $classname$::GetDescriptor() {\n  return descriptor();\n}\n\n"
                    );
  GenerateNotImplementedMethods(this,local_18);
  GenerateCallMethod(this,local_18);
  GenerateGetPrototype(this,REQUEST,local_18);
  GenerateGetPrototype(this,RESPONSE,local_18);
  io::Printer::Print(local_18,&this->vars_,
                     "$classname$_Stub::$classname$_Stub(::google::protobuf::RpcChannel* channel)\n  : channel_(channel), owns_channel_(false) {}\n$classname$_Stub::$classname$_Stub(\n    ::google::protobuf::RpcChannel* channel,\n    ::google::protobuf::Service::ChannelOwnership ownership)\n  : channel_(channel),\n    owns_channel_(ownership == ::google::protobuf::Service::STUB_OWNS_CHANNEL) {}\n$classname$_Stub::~$classname$_Stub() {\n  if (owns_channel_) delete channel_;\n}\n\n"
                    );
  GenerateStubMethods(this,local_18);
  return;
}

Assistant:

void ServiceGenerator::GenerateImplementation(io::Printer* printer) {
  vars_["index"] = SimpleItoa(index_in_metadata_);
  printer->Print(
      vars_,
      "$classname$::~$classname$() {}\n"
      "\n"
      "const ::google::protobuf::ServiceDescriptor* $classname$::descriptor() {\n"
      "  $file_namespace$::protobuf_AssignDescriptorsOnce();\n"
      "  return $file_namespace$::file_level_service_descriptors[$index$];\n"
      "}\n"
      "\n"
      "const ::google::protobuf::ServiceDescriptor* $classname$::GetDescriptor() {\n"
      "  return descriptor();\n"
      "}\n"
      "\n");

  // Generate methods of the interface.
  GenerateNotImplementedMethods(printer);
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);

  // Generate stub implementation.
  printer->Print(vars_,
    "$classname$_Stub::$classname$_Stub(::google::protobuf::RpcChannel* channel)\n"
    "  : channel_(channel), owns_channel_(false) {}\n"
    "$classname$_Stub::$classname$_Stub(\n"
    "    ::google::protobuf::RpcChannel* channel,\n"
    "    ::google::protobuf::Service::ChannelOwnership ownership)\n"
    "  : channel_(channel),\n"
    "    owns_channel_(ownership == ::google::protobuf::Service::STUB_OWNS_CHANNEL) {}\n"
    "$classname$_Stub::~$classname$_Stub() {\n"
    "  if (owns_channel_) delete channel_;\n"
    "}\n"
    "\n");

  GenerateStubMethods(printer);
}